

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O1

void handle_inform_queue(list<InformItem_*,_std::allocator<InformItem_*>_> *informList)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long *plVar3;
  iterator __end1;
  _List_node_base *p_Var4;
  _Any_data local_5c8;
  code *local_5b8;
  code *local_5b0;
  undefined1 local_5a8 [1408];
  
  p_Var4 = (informList->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)informList) {
    do {
      p_Var1 = p_Var4[1]._M_next;
      if ((((*(char *)((long)(p_Var1 + 1) + 8) == '\0') &&
           (p_Var1[1]._M_next < (ulong)-(long)p_Var1[3]._M_next)) &&
          (*(undefined1 *)&p_Var1[4]._M_next = 1, *(int *)&p_Var1->_M_prev != 0)) &&
         (p_Var2 = *(_List_node_base **)((long)(p_Var1 + 3) + 8), p_Var2 != (_List_node_base *)0x0))
      {
        if ((p_Var2[0x10]._M_next != (_List_node_base *)0x0) &&
           (plVar3 = (long *)p_Var2[0xd]._M_next, plVar3 != (long *)0x0)) {
          memset(local_5a8,0,0x578);
          (**(code **)(*plVar3 + 0x10))(plVar3,local_5a8,0x578);
        }
        p_Var1[3]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var1[4]._M_next = 0;
        *(int *)&p_Var1->_M_prev = *(int *)&p_Var1->_M_prev + -1;
      }
      p_Var4 = (((_List_base<InformItem_*,_std::allocator<InformItem_*>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)informList);
  }
  local_5c8._M_unused._M_object = (void *)0x0;
  local_5c8._8_8_ = 0;
  local_5b0 = std::
              _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:98:41)>
              ::_M_invoke;
  local_5b8 = std::
              _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:98:41)>
              ::_M_manager;
  remove_inform_from_list(informList,(function<bool_(InformItem_*)> *)&local_5c8);
  if (local_5b8 != (code *)0x0) {
    (*local_5b8)((_Any_data *)&local_5c8,(_Any_data *)&local_5c8,__destroy_functor);
  }
  return;
}

Assistant:

void handle_inform_queue(std::list<struct InformItem *> &informList) {
    auto thisLoop = millis();
    for(auto informItem : informList){
        if(!informItem->received && thisLoop - informItem->lastSent > informItem->delay_ms){
            SNMP_LOGD("Missed Inform receive\n");
            // check if sending again
            informItem->missed = true;
            if(!informItem->retries){
                SNMP_LOGD("No more retries for inform: %lu, removing\n", informItem->requestID);
                continue;
            }
            if(informItem->trap){
                SNMP_LOGD("No response received in %lums, Resending Inform: %lu\n", thisLoop - informItem->lastSent, informItem->requestID);
                informItem->trap->sendTo(informItem->ip, true);
                informItem->lastSent = thisLoop;
                informItem->missed = false;
                informItem->retries--;
            }
        }
    }
    remove_inform_from_list(informList, [](struct InformItem* informItem) -> bool {
        return informItem->received || (informItem->retries == 0 && informItem->missed);
    });
}